

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * cfd::core::HashUtil::Ripemd160(ByteData160 *__return_storage_ptr__,ByteData160 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData160 *local_18;
  ByteData160 *data_local;
  
  local_18 = data;
  data_local = __return_storage_ptr__;
  ByteData160::GetBytes(&local_30,data);
  Ripemd160(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Ripemd160(const ByteData160 &data) {
  return Ripemd160(data.GetBytes());
}